

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

natwm_error map_search(map *map,void *key,uint32_t *index)

{
  map_entry *pmVar1;
  bool bVar2;
  _Bool _Var3;
  natwm_error nVar4;
  uint32_t uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  nVar4 = GENERIC_ERROR;
  if (index != (uint32_t *)0x0 && key != (void *)0x0) {
    sVar6 = (*map->key_size_function)(key);
    uVar5 = (*map->hash_function)(key,sVar6);
    uVar7 = (ulong)map->length;
    uVar9 = (ulong)uVar5 % uVar7;
    uVar8 = 0xffffffffffffffff;
    do {
      if ((uint)uVar7 <= (uint)uVar9) {
        uVar9 = 0;
      }
      pmVar1 = map->entries[uVar9];
      if ((((pmVar1 == (map_entry *)0x0) || (pmVar1->key == (void *)0x0)) ||
          ((int *)pmVar1->value == &EMPTY_ENTRY)) ||
         (_Var3 = (*map->key_compare_function)(key,pmVar1->key,sVar6), !_Var3)) {
        uVar9 = (ulong)((uint32_t)uVar9 + 1);
        bVar2 = true;
      }
      else {
        *index = (uint32_t)uVar9;
        bVar2 = false;
      }
      if (!bVar2) {
        return NO_ERROR;
      }
      uVar7 = (ulong)map->length;
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar7);
    nVar4 = NOT_FOUND_ERROR;
  }
  return nVar4;
}

Assistant:

static enum natwm_error map_search(const struct map *map, const void *key, uint32_t *index)
{
        if (key == NULL || index == NULL) {
                return GENERIC_ERROR;
        }

        // Initialize index with initial bucket index
        size_t key_size = map->key_size_function(key);
        uint32_t current_index = map->hash_function(key, key_size) % map->length;

        for (size_t i = 0; i <= map->length; ++i) {
                if ((current_index) >= map->length) {
                        current_index = 0;
                }

                struct map_entry *entry = map->entries[current_index];

                if (!is_entry_present(entry)
                    || !map->key_compare_function(key, entry->key, key_size)) {
                        current_index += 1;

                        continue;
                }

                *index = current_index;

                return NO_ERROR;
        }

        return NOT_FOUND_ERROR;
}